

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBools::ByteSizeLong
          (TensorValue_RepeatedBools *this)

{
  uint value;
  int iVar1;
  ulong size;
  size_t sVar2;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  long lStack_18;
  uint count;
  size_t total_size;
  TensorValue_RepeatedBools *this_local;
  
  lStack_18 = 0;
  value = values_size(this);
  size = (ulong)value;
  if (size != 0) {
    sVar2 = google::protobuf::internal::WireFormatLite::Int32Size(value);
    lStack_18 = sVar2 + 1;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(size);
  this->_values_cached_byte_size_ = iVar1;
  iVar1 = google::protobuf::internal::ToCachedSize(size + lStack_18);
  this->_cached_size_ = iVar1;
  return size + lStack_18;
}

Assistant:

size_t TensorValue_RepeatedBools::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.TensorValue.RepeatedBools)
  size_t total_size = 0;

  // repeated bool values = 1 [packed = true];
  {
    unsigned int count = this->values_size();
    size_t data_size = 1UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _values_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}